

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O3

int SoapySDRDevice_readStream
              (SoapySDRDevice *device,SoapySDRStream *stream,void **buffs,size_t numElems,int *flags
              ,longlong *timeNs,long timeoutUs)

{
  int iVar1;
  undefined1 *puVar2;
  
  puVar2 = (undefined1 *)__tls_get_addr(&PTR_0014ce88);
  *puVar2 = 0;
  *(undefined4 *)(puVar2 + 0x400) = 0;
  iVar1 = (**(code **)(*(long *)device + 0x90))(device,stream,buffs,numElems,flags,timeNs,timeoutUs)
  ;
  return iVar1;
}

Assistant:

int SoapySDRDevice_readStream(SoapySDRDevice *device, SoapySDRStream *stream, void * const *buffs, const size_t numElems, int *flags, long long *timeNs, const long timeoutUs)
{
    __SOAPY_SDR_C_TRY
    return device->readStream(reinterpret_cast<SoapySDR::Stream *>(stream), buffs, numElems, *flags, *timeNs, timeoutUs);
    __SOAPY_SDR_C_CATCH_RET(SOAPY_SDR_STREAM_ERROR);
}